

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameParseSql(Parse *p,char *zDb,sqlite3 *db,char *zSql,int bTemp)

{
  int iVar1;
  u8 local_3c;
  int local_38;
  int rc;
  int bTemp_local;
  char *zSql_local;
  sqlite3 *db_local;
  char *zDb_local;
  Parse *p_local;
  
  sqlite3ParseObjectInit(p,db);
  if (zSql == (char *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    iVar1 = sqlite3_strnicmp(zSql,"CREATE ",7);
    if (iVar1 == 0) {
      if (bTemp == 0) {
        iVar1 = sqlite3FindDbName(db,zDb);
        local_3c = (u8)iVar1;
      }
      else {
        local_3c = '\x01';
      }
      (db->init).iDb = local_3c;
      p->eParseMode = '\x02';
      p->db = db;
      p->nQueryLoop = 1;
      local_38 = sqlite3RunParser(p,zSql);
      if (db->mallocFailed != '\0') {
        local_38 = 7;
      }
      if ((((local_38 == 0) && (p->pNewTable == (Table *)0x0)) && (p->pNewIndex == (Index *)0x0)) &&
         (p->pNewTrigger == (Trigger *)0x0)) {
        local_38 = sqlite3CorruptError(0x1b847);
      }
      (db->init).iDb = '\0';
      p_local._4_4_ = local_38;
    }
    else {
      p_local._4_4_ = sqlite3CorruptError(0x1b83c);
    }
  }
  return p_local._4_4_;
}

Assistant:

static int renameParseSql(
  Parse *p,                       /* Memory to use for Parse object */
  const char *zDb,                /* Name of schema SQL belongs to */
  sqlite3 *db,                    /* Database handle */
  const char *zSql,               /* SQL to parse */
  int bTemp                       /* True if SQL is from temp schema */
){
  int rc;

  sqlite3ParseObjectInit(p, db);
  if( zSql==0 ){
    return SQLITE_NOMEM;
  }
  if( sqlite3StrNICmp(zSql,"CREATE ",7)!=0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  db->init.iDb = bTemp ? 1 : sqlite3FindDbName(db, zDb);
  p->eParseMode = PARSE_MODE_RENAME;
  p->db = db;
  p->nQueryLoop = 1;
  rc = sqlite3RunParser(p, zSql);
  if( db->mallocFailed ) rc = SQLITE_NOMEM;
  if( rc==SQLITE_OK
   && NEVER(p->pNewTable==0 && p->pNewIndex==0 && p->pNewTrigger==0)
  ){
    rc = SQLITE_CORRUPT_BKPT;
  }

#ifdef SQLITE_DEBUG
  /* Ensure that all mappings in the Parse.pRename list really do map to
  ** a part of the input string.  */
  if( rc==SQLITE_OK ){
    int nSql = sqlite3Strlen30(zSql);
    RenameToken *pToken;
    for(pToken=p->pRename; pToken; pToken=pToken->pNext){
      assert( pToken->t.z>=zSql && &pToken->t.z[pToken->t.n]<=&zSql[nSql] );
    }
  }
#endif

  db->init.iDb = 0;
  return rc;
}